

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O3

void __thiscall
QDateTimeEditPrivate::emitSignals(QDateTimeEditPrivate *this,EmitPolicy ep,QVariant *old)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  QObject *pQVar4;
  byte bVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  bool bVar13;
  undefined8 local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (ep != NeverEmit) {
    pQVar4 = *(QObject **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
    puVar1 = &(this->super_QAbstractSpinBoxPrivate).field_0x3d0;
    *puVar1 = *puVar1 & 0xfe;
    lVar9 = ::QVariant::toDate();
    uVar2 = (this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
            super_QFlagsStorage<QDateTimeEdit::Section>.i;
    bVar12 = true;
    if (ep != AlwaysEmit) {
      lVar10 = ::QVariant::toDate();
      lVar11 = ::QVariant::toDate();
      bVar12 = lVar10 != lVar11;
    }
    uVar6 = ::QVariant::toTime();
    local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,uVar6);
    bVar5 = QTime::isValid();
    uVar3 = (this->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
            super_QFlagsStorage<QDateTimeEdit::Section>.i;
    bVar13 = true;
    if (ep != AlwaysEmit) {
      iVar7 = ::QVariant::toTime();
      iVar8 = ::QVariant::toTime();
      bVar13 = iVar7 != iVar8;
    }
    (**(code **)(*(long *)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (&local_58,this);
    updateCache(this,&(this->super_QAbstractSpinBoxPrivate).value,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    syncCalendarWidget(this);
    if ((bVar12 | bVar13) == 1) {
      ::QVariant::toDateTime();
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)&local_60;
      QMetaObject::activate(pQVar4,&QDateTimeEdit::staticMetaObject,0,(void **)&local_58);
      QDateTime::~QDateTime((QDateTime *)&local_60);
    }
    if (((lVar9 + 0xb69eeff91fU < 0x16d3e147974 && (uVar2 & 0x3f00) != 0) & bVar12) == 1) {
      local_60 = ::QVariant::toDate();
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)&local_60;
      QMetaObject::activate(pQVar4,&QDateTimeEdit::staticMetaObject,2,(void **)&local_58);
    }
    if ((bVar5 & (uVar3 & 0x7f) != 0 & bVar13) == 1) {
      uVar6 = ::QVariant::toTime();
      local_60 = CONCAT44(local_60._4_4_,uVar6);
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)&local_60;
      QMetaObject::activate(pQVar4,&QDateTimeEdit::staticMetaObject,1,(void **)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::emitSignals(EmitPolicy ep, const QVariant &old)
{
    Q_Q(QDateTimeEdit);
    if (ep == NeverEmit) {
        return;
    }
    pendingEmit = false;

    const bool dodate = value.toDate().isValid() && (sections & DateSectionMask);
    const bool datechanged = (ep == AlwaysEmit || old.toDate() != value.toDate());
    const bool dotime = value.toTime().isValid() && (sections & TimeSectionMask);
    const bool timechanged = (ep == AlwaysEmit || old.toTime() != value.toTime());

    updateCache(value, displayText());

    syncCalendarWidget();
    if (datechanged || timechanged)
        emit q->dateTimeChanged(value.toDateTime());
    if (dodate && datechanged)
        emit q->dateChanged(value.toDate());
    if (dotime && timechanged)
        emit q->timeChanged(value.toTime());

}